

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableHeader(char *label)

{
  ImVec2 *pIVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  ImGuiTable *pIVar5;
  ImDrawList *draw_list;
  ulong uVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImGuiID id;
  ImU32 IVar9;
  ImGuiSortDirection sort_direction;
  ImGuiTableColumn *pIVar10;
  ImGuiTableColumnIdx IVar11;
  int iVar12;
  char *pcVar13;
  long lVar14;
  ImGuiTableColumn *column;
  bool bVar15;
  uint uVar16;
  uint uVar17;
  ImVec2 pos;
  ImVec2 pos_00;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  bool held;
  bool hovered;
  char sort_order_suf [4];
  ImVec2 label_pos;
  ImVec2 label_size;
  ImRect bb;
  bool local_fa;
  bool local_f9;
  ImGuiWindow *local_f8;
  char local_ec [4];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  ImVec2 local_c8;
  ImVec2 local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  long local_98;
  char *local_90;
  undefined1 local_88 [16];
  char *local_78;
  ImVec2 local_70;
  undefined1 local_68 [16];
  ImRect local_58;
  undefined1 local_48 [16];
  undefined8 extraout_XMM0_Qb;
  
  pIVar7 = GImGui;
  local_f8 = GImGui->CurrentWindow;
  if (local_f8->SkipItems != false) {
    return;
  }
  pIVar5 = GImGui->CurrentTable;
  iVar12 = pIVar5->CurrentColumn;
  lVar14 = (long)iVar12;
  column = (pIVar5->Columns).Data + lVar14;
  pcVar13 = "";
  if (label != (char *)0x0) {
    pcVar13 = label;
  }
  local_78 = FindRenderedTextEnd(pcVar13,(char *)0x0);
  local_c0 = CalcTextSize(pcVar13,local_78,true,-1.0);
  local_c8 = (local_f8->DC).CursorPos;
  pIVar10 = (pIVar5->Columns).Data;
  fVar20 = pIVar10[lVar14].MinX;
  fVar21 = pIVar10[lVar14].MaxX;
  fVar2 = (pIVar5->WorkRect).Min.x;
  uVar16 = -(uint)(fVar2 <= fVar20);
  local_e8 = ZEXT416(~uVar16 & (uint)fVar2 | (uint)fVar20 & uVar16);
  fVar20 = (pIVar5->WorkRect).Max.x;
  if (fVar20 <= fVar21) {
    fVar21 = fVar20;
  }
  local_d8 = ZEXT416((uint)fVar21);
  local_88._0_4_ = pIVar5->RowPosY1;
  local_48 = ZEXT416((uint)pIVar5->RowPosY2);
  fVar20 = pIVar5->RowMinHeight - (pIVar5->CellPaddingY + pIVar5->CellPaddingY);
  uVar16 = -(uint)(fVar20 <= local_c0.y);
  local_68 = ZEXT416(uVar16 & (uint)local_c0.y | ~uVar16 & (uint)fVar20);
  local_ec[0] = '\0';
  local_ec[1] = '\0';
  local_ec[2] = '\0';
  local_ec[3] = '\0';
  auVar19 = ZEXT816(0);
  if (((pIVar5->Flags & 8) == 0) || ((column->Flags & 0x200) != 0)) {
    local_a8._0_4_ = 0.0;
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
  }
  else {
    local_a8._0_4_ = (undefined4)(int)(pIVar7->FontSize * 0.65 + (pIVar7->Style).FramePadding.x);
    local_a8._4_4_ = 0;
    local_a8._8_4_ = 0;
    local_a8._12_4_ = 0;
    if ('\0' < column->SortOrder) {
      local_a8 = ZEXT416((uint)local_a8._0_4_);
      ImFormatString(local_ec,4,"%d");
      local_b8._0_4_ = (pIVar7->Style).ItemInnerSpacing.x;
      auVar18._0_8_ = CalcTextSize(local_ec,(char *)0x0,false,-1.0);
      auVar18._8_8_ = extraout_XMM0_Qb;
      auVar19._4_12_ = auVar18._4_12_;
      auVar19._0_4_ = auVar18._0_4_ + (float)local_b8._0_4_;
    }
  }
  fVar20 = local_c8.x + local_c0.x + auVar19._0_4_ + (float)local_a8._0_4_;
  uVar3 = column->ContentMaxXHeadersUsed;
  uVar4 = column->ContentMaxXHeadersIdeal;
  uVar16 = -(uint)(column->WorkMaxX <= (float)uVar3);
  uVar17 = -(uint)(fVar20 <= (float)uVar4);
  uVar6 = CONCAT44(~uVar17 & (uint)fVar20,~uVar16 & (uint)column->WorkMaxX) |
          CONCAT44(uVar4 & uVar17,uVar3 & uVar16);
  column->ContentMaxXHeadersUsed = (float)(int)uVar6;
  column->ContentMaxXHeadersIdeal = (float)(int)(uVar6 >> 0x20);
  if ((pIVar5->IsContextPopupOpen == true) && (iVar12 == pIVar5->ContextPopupColumn)) {
    bVar15 = pIVar5->InstanceInteracted == pIVar5->InstanceCurrent;
  }
  else {
    bVar15 = false;
  }
  local_b8 = auVar19;
  local_98 = lVar14;
  local_90 = pcVar13;
  id = ImGuiWindow::GetID(local_f8,pcVar13,(char *)0x0);
  fVar20 = (pIVar7->Style).CellPadding.y;
  fVar20 = fVar20 + fVar20 + (float)local_68._0_4_ + (float)local_88._0_4_;
  uVar16 = -(uint)(fVar20 <= (float)local_48._0_4_);
  local_58.Max.y = (float)(uVar16 & local_48._0_4_ | ~uVar16 & (uint)fVar20);
  local_58.Min.x = (float)local_e8._0_4_;
  local_58.Min.y = (float)local_88._0_4_;
  local_58.Max.x = (float)local_d8._0_4_;
  local_70.x = 0.0;
  local_70.y = (float)local_68._0_4_;
  ItemSize(&local_70,-1.0);
  bVar8 = ItemAdd(&local_58,id,(ImRect *)0x0,0);
  if (!bVar8) {
    return;
  }
  bVar8 = ButtonBehavior(&local_58,id,&local_f9,&local_fa,0x1000);
  if (pIVar7->ActiveId != id) {
    SetItemAllowOverlap();
  }
  if (((local_fa | local_f9) & 1U) == 0 && !bVar15) {
    uVar16 = 0x2a;
    if ((pIVar5->field_0x98 & 1) != 0) goto LAB_002376e9;
  }
  else {
    uVar16 = 0x1a;
    if (local_fa == false) {
      uVar16 = local_f9 & 1 | 0x18;
    }
  }
  IVar9 = GetColorU32(uVar16,1.0);
  TableSetBgColor(3,IVar9,pIVar5->CurrentColumn);
LAB_002376e9:
  RenderNavHighlight(&local_58,id,10);
  lVar14 = local_98;
  if (local_fa == true) {
    IVar11 = (ImGuiTableColumnIdx)local_98;
    pIVar5->HeldHeaderColumn = IVar11;
    (local_f8->DC).CursorPos.y = (pIVar7->Style).ItemSpacing.y * -0.5 + (local_f8->DC).CursorPos.y;
    if ((pIVar5->Flags & 2) != 0) {
      bVar15 = IsMouseDragging(0,-1.0);
      if ((bVar15) && (pIVar7->DragDropActive == false)) {
        pIVar5->ReorderColumn = IVar11;
        pIVar5->InstanceInteracted = pIVar5->InstanceCurrent;
        pIVar1 = &(pIVar7->IO).MouseDelta;
        if ((pIVar1->x <= 0.0 && pIVar1->x != 0.0) &&
           (pIVar1 = &(pIVar7->IO).MousePos,
           pIVar1->x <= (float)local_e8._0_4_ && (float)local_e8._0_4_ != pIVar1->x)) {
          if ((long)column->PrevEnabledColumn == -1) {
            pIVar10 = (ImGuiTableColumn *)0x0;
          }
          else {
            pIVar10 = (pIVar5->Columns).Data + column->PrevEnabledColumn;
          }
          if (((pIVar10 != (ImGuiTableColumn *)0x0) &&
              (((pIVar10->Flags | column->Flags) & 0x40U) == 0)) &&
             (column->IndexWithinEnabledSet < pIVar5->FreezeColumnsRequest !=
              pIVar5->FreezeColumnsRequest <= pIVar10->IndexWithinEnabledSet)) {
            pIVar5->ReorderColumnDir = -1;
          }
        }
        if ((0.0 < (pIVar7->IO).MouseDelta.x) && ((float)local_d8._0_4_ < (pIVar7->IO).MousePos.x))
        {
          if ((long)column->NextEnabledColumn == -1) {
            pIVar10 = (ImGuiTableColumn *)0x0;
          }
          else {
            pIVar10 = (pIVar5->Columns).Data + column->NextEnabledColumn;
          }
          if (((pIVar10 != (ImGuiTableColumn *)0x0) &&
              (((pIVar10->Flags | column->Flags) & 0x40U) == 0)) &&
             (column->IndexWithinEnabledSet < pIVar5->FreezeColumnsRequest !=
              pIVar5->FreezeColumnsRequest <= pIVar10->IndexWithinEnabledSet)) {
            pIVar5->ReorderColumnDir = '\x01';
          }
        }
      }
    }
  }
  else {
    (local_f8->DC).CursorPos.y = (pIVar7->Style).ItemSpacing.y * -0.5 + (local_f8->DC).CursorPos.y;
  }
  iVar12 = (int)lVar14;
  local_d8._0_4_ = ((float)local_d8._0_4_ - (float)local_a8._0_4_) - (float)local_b8._0_4_;
  if (((pIVar5->Flags & 8) != 0) && ((column->Flags & 0x200) == 0)) {
    if (column->SortOrder != -1) {
      local_88 = ZEXT416((uint)local_c8.y);
      local_e8._4_4_ = local_d8._4_4_ & local_e8._4_4_;
      local_e8._0_4_ =
           ~-(uint)((float)local_d8._0_4_ <= (float)local_e8._0_4_) & local_d8._0_4_ |
           -(uint)((float)local_d8._0_4_ <= (float)local_e8._0_4_) & local_e8._0_4_;
      local_e8._8_4_ = local_d8._8_4_ & local_e8._8_4_;
      local_e8._12_4_ = local_d8._12_4_ & local_e8._12_4_;
      if ('\0' < column->SortOrder) {
        IVar9 = GetColorU32(0,0.7);
        PushStyleColor(0,IVar9);
        pos.x = (pIVar7->Style).ItemInnerSpacing.x + (float)local_e8._0_4_;
        pos.y = (float)local_88._0_4_;
        RenderText(pos,local_ec,(char *)0x0,true);
        PopStyleColor(1);
        local_e8._0_4_ = (float)local_e8._0_4_ + (float)local_b8._0_4_;
      }
      draw_list = local_f8->DrawList;
      IVar9 = GetColorU32(0,1.0);
      pos_00.y = (float)local_88._0_4_;
      pos_00.x = (float)local_e8._0_4_;
      RenderArrow(draw_list,pos_00,IVar9,(column->field_0x65 & 3) == 1 ^ 3,0.65);
    }
    if ((bVar8) && (iVar12 != pIVar5->ReorderColumn)) {
      sort_direction = TableGetColumnNextSortDirection(column);
      TableSetColumnSortDirection(iVar12,sort_direction,(pIVar7->IO).KeyShift);
    }
  }
  pcVar13 = local_78;
  local_70.y = local_c8.y + (float)local_68._0_4_ + (pIVar7->Style).FramePadding.y;
  local_70.x = (float)local_d8._0_4_;
  RenderTextEllipsis(local_f8->DrawList,&local_c8,&local_70,(float)local_d8._0_4_,
                     (float)local_d8._0_4_,local_90,local_78,&local_c0);
  if (((((float)local_d8._0_4_ - local_c8.x < local_c0.x) && (local_f9 == true)) &&
      (pIVar7->ActiveId == 0)) && (bVar15 = IsItemHovered(0x800), bVar15)) {
    SetTooltip("%.*s",(ulong)(uint)((int)pcVar13 - (int)local_90));
  }
  bVar15 = IsMouseReleased(1);
  if ((bVar15) && (bVar15 = IsItemHovered(0), bVar15)) {
    TableOpenContextMenu(iVar12);
  }
  return;
}

Assistant:

void ImGui::TableHeader(const char* label)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeader() after BeginTable()!");
    IM_ASSERT(table->CurrentColumn != -1);
    const int column_n = table->CurrentColumn;
    ImGuiTableColumn* column = &table->Columns[column_n];

    // Label
    if (label == NULL)
        label = "";
    const char* label_end = FindRenderedTextEnd(label);
    ImVec2 label_size = CalcTextSize(label, label_end, true);
    ImVec2 label_pos = window->DC.CursorPos;

    // If we already got a row height, there's use that.
    // FIXME-TABLE: Padding problem if the correct outer-padding CellBgRect strays off our ClipRect?
    ImRect cell_r = TableGetCellBgRect(table, column_n);
    float label_height = ImMax(label_size.y, table->RowMinHeight - table->CellPaddingY * 2.0f);

    // Calculate ideal size for sort order arrow
    float w_arrow = 0.0f;
    float w_sort_text = 0.0f;
    char sort_order_suf[4] = "";
    const float ARROW_SCALE = 0.65f;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        w_arrow = ImFloor(g.FontSize * ARROW_SCALE + g.Style.FramePadding.x);
        if (column->SortOrder > 0)
        {
            ImFormatString(sort_order_suf, IM_ARRAYSIZE(sort_order_suf), "%d", column->SortOrder + 1);
            w_sort_text = g.Style.ItemInnerSpacing.x + CalcTextSize(sort_order_suf).x;
        }
    }

    // We feed our unclipped width to the column without writing on CursorMaxPos, so that column is still considering for merging.
    float max_pos_x = label_pos.x + label_size.x + w_sort_text + w_arrow;
    column->ContentMaxXHeadersUsed = ImMax(column->ContentMaxXHeadersUsed, column->WorkMaxX);
    column->ContentMaxXHeadersIdeal = ImMax(column->ContentMaxXHeadersIdeal, max_pos_x);

    // Keep header highlighted when context menu is open.
    const bool selected = (table->IsContextPopupOpen && table->ContextPopupColumn == column_n && table->InstanceInteracted == table->InstanceCurrent);
    ImGuiID id = window->GetID(label);
    ImRect bb(cell_r.Min.x, cell_r.Min.y, cell_r.Max.x, ImMax(cell_r.Max.y, cell_r.Min.y + label_height + g.Style.CellPadding.y * 2.0f));
    ItemSize(ImVec2(0.0f, label_height)); // Don't declare unclipped width, it'll be fed ContentMaxPosHeadersIdeal
    if (!ItemAdd(bb, id))
        return;

    //GetForegroundDrawList()->AddRect(cell_r.Min, cell_r.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]
    //GetForegroundDrawList()->AddRect(bb.Min, bb.Max, IM_COL32(255, 0, 0, 255)); // [DEBUG]

    // Using AllowItemOverlap mode because we cover the whole cell, and we want user to be able to submit subsequent items.
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();
    if (held || hovered || selected)
    {
        const ImU32 col = GetColorU32(held ? ImGuiCol_HeaderActive : hovered ? ImGuiCol_HeaderHovered : ImGuiCol_Header);
        //RenderFrame(bb.Min, bb.Max, col, false, 0.0f);
        TableSetBgColor(ImGuiTableBgTarget_CellBg, col, table->CurrentColumn);
    }
    else
    {
        // Submit single cell bg color in the case we didn't submit a full header row
        if ((table->RowFlags & ImGuiTableRowFlags_Headers) == 0)
            TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_TableHeaderBg), table->CurrentColumn);
    }
    RenderNavHighlight(bb, id, ImGuiNavHighlightFlags_TypeThin | ImGuiNavHighlightFlags_NoRounding);
    if (held)
        table->HeldHeaderColumn = (ImGuiTableColumnIdx)column_n;
    window->DC.CursorPos.y -= g.Style.ItemSpacing.y * 0.5f;

    // Drag and drop to re-order columns.
    // FIXME-TABLE: Scroll request while reordering a column and it lands out of the scrolling zone.
    if (held && (table->Flags & ImGuiTableFlags_Reorderable) && IsMouseDragging(0) && !g.DragDropActive)
    {
        // While moving a column it will jump on the other side of the mouse, so we also test for MouseDelta.x
        table->ReorderColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;

        // We don't reorder: through the frozen<>unfrozen line, or through a column that is marked with ImGuiTableColumnFlags_NoReorder.
        if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < cell_r.Min.x)
            if (ImGuiTableColumn* prev_column = (column->PrevEnabledColumn != -1) ? &table->Columns[column->PrevEnabledColumn] : NULL)
                if (!((column->Flags | prev_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (prev_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = -1;
        if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > cell_r.Max.x)
            if (ImGuiTableColumn* next_column = (column->NextEnabledColumn != -1) ? &table->Columns[column->NextEnabledColumn] : NULL)
                if (!((column->Flags | next_column->Flags) & ImGuiTableColumnFlags_NoReorder))
                    if ((column->IndexWithinEnabledSet < table->FreezeColumnsRequest) == (next_column->IndexWithinEnabledSet < table->FreezeColumnsRequest))
                        table->ReorderColumnDir = +1;
    }

    // Sort order arrow
    const float ellipsis_max = cell_r.Max.x - w_arrow - w_sort_text;
    if ((table->Flags & ImGuiTableFlags_Sortable) && !(column->Flags & ImGuiTableColumnFlags_NoSort))
    {
        if (column->SortOrder != -1)
        {
            float x = ImMax(cell_r.Min.x, cell_r.Max.x - w_arrow - w_sort_text);
            float y = label_pos.y;
            if (column->SortOrder > 0)
            {
                PushStyleColor(ImGuiCol_Text, GetColorU32(ImGuiCol_Text, 0.70f));
                RenderText(ImVec2(x + g.Style.ItemInnerSpacing.x, y), sort_order_suf);
                PopStyleColor();
                x += w_sort_text;
            }
            RenderArrow(window->DrawList, ImVec2(x, y), GetColorU32(ImGuiCol_Text), column->SortDirection == ImGuiSortDirection_Ascending ? ImGuiDir_Up : ImGuiDir_Down, ARROW_SCALE);
        }

        // Handle clicking on column header to adjust Sort Order
        if (pressed && table->ReorderColumn != column_n)
        {
            ImGuiSortDirection sort_direction = TableGetColumnNextSortDirection(column);
            TableSetColumnSortDirection(column_n, sort_direction, g.IO.KeyShift);
        }
    }

    // Render clipped label. Clipping here ensure that in the majority of situations, all our header cells will
    // be merged into a single draw call.
    //window->DrawList->AddCircleFilled(ImVec2(ellipsis_max, label_pos.y), 40, IM_COL32_WHITE);
    RenderTextEllipsis(window->DrawList, label_pos, ImVec2(ellipsis_max, label_pos.y + label_height + g.Style.FramePadding.y), ellipsis_max, ellipsis_max, label, label_end, &label_size);

    const bool text_clipped = label_size.x > (ellipsis_max - label_pos.x);
    if (text_clipped && hovered && g.ActiveId == 0 && IsItemHovered(ImGuiHoveredFlags_DelayNormal))
        SetTooltip("%.*s", (int)(label_end - label), label);

    // We don't use BeginPopupContextItem() because we want the popup to stay up even after the column is hidden
    if (IsMouseReleased(1) && IsItemHovered())
        TableOpenContextMenu(column_n);
}